

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Setpoint.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Setpoint::ArchiveIN(ChFunction_Setpoint *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Setpoint>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30._value = &this->Y;
  local_30._name = "Y";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->Y_dx;
  local_48._name = "Y_dx";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->Y_dxdx;
  local_60._name = "Y_dxdx";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChFunction_Setpoint::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Setpoint>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(Y);
    marchive >> CHNVP(Y_dx);
    marchive >> CHNVP(Y_dxdx);
}